

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int find_conflict_base(int cbase)

{
  int local_18;
  int local_14;
  int j;
  int i;
  int cbase_local;
  
  local_14 = 0;
  while( true ) {
    if (cbase <= local_14) {
      return cbase;
    }
    local_18 = 0;
    while ((local_18 + cbase < nconflicts &&
           (conflicts[local_14 + local_18] == conflicts[cbase + local_18]))) {
      local_18 = local_18 + 1;
    }
    if (nconflicts <= local_18 + cbase) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int find_conflict_base(int cbase)
{
    int i,j;

    for (i=0; i<cbase; i++) {
	for (j=0; j+cbase < nconflicts; j++) {
	    if (conflicts[i+j] != conflicts[cbase+j])
		break; }
	if (j+cbase >= nconflicts)
	    return i; }
    return cbase;
}